

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.c
# Opt level: O3

void opj_sparse_array_int32_free(opj_sparse_array_int32_t *sa)

{
  OPJ_UINT32 OVar1;
  OPJ_UINT32 OVar2;
  ulong uVar3;
  
  if (sa != (opj_sparse_array_int32_t *)0x0) {
    OVar1 = sa->block_count_hor;
    OVar2 = sa->block_count_ver;
    if (OVar2 * OVar1 != 0) {
      uVar3 = 0;
      do {
        if (sa->data_blocks[uVar3] != (OPJ_INT32 *)0x0) {
          opj_free(sa->data_blocks[uVar3]);
          OVar1 = sa->block_count_hor;
          OVar2 = sa->block_count_ver;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < OVar2 * OVar1);
    }
    opj_free(sa->data_blocks);
    opj_free(sa);
    return;
  }
  return;
}

Assistant:

void opj_sparse_array_int32_free(opj_sparse_array_int32_t* sa)
{
    if (sa) {
        OPJ_UINT32 i;
        for (i = 0; i < sa->block_count_hor * sa->block_count_ver; i++) {
            if (sa->data_blocks[i]) {
                opj_free(sa->data_blocks[i]);
            }
        }
        opj_free(sa->data_blocks);
        opj_free(sa);
    }
}